

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O1

uint __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Split
          (PageStack<Memory::MarkContext::MarkCandidate> *this,uint targetCount,
          PageStack<Memory::MarkContext::MarkCandidate> **targetStacks)

{
  size_t *psVar1;
  PageStack<Memory::MarkContext::MarkCandidate> *pPVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  Chunk *pCVar7;
  Chunk *pCVar8;
  Chunk *pCVar9;
  uint uVar10;
  ulong uVar11;
  long lStack_70;
  Chunk *local_68;
  Chunk *targetCurrents [3];
  ulong uVar12;
  
  if (2 < targetCount - 1) {
    AssertCount = AssertCount + 1;
    lStack_70 = 0x6fbeb7;
    Js::Throw::LogAssert();
    lStack_70 = 0x6fbec7;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    lStack_70 = 0x6fbeef;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0xfa,"(targetCount > 0 && targetCount <= MaxSplitTargets)",
                       "targetCount > 0 && targetCount <= MaxSplitTargets");
    if (!bVar4) goto LAB_006fc15c;
    *puVar5 = 0;
  }
  if (targetStacks == (PageStack<Memory::MarkContext::MarkCandidate> **)0x0) {
    AssertCount = AssertCount + 1;
    lStack_70 = 0x6fbf11;
    Js::Throw::LogAssert();
    lStack_70 = 0x6fbf21;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    lStack_70 = 0x6fbf49;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0xfb,"(targetStacks)","targetStacks");
    if (!bVar4) goto LAB_006fc15c;
    *puVar5 = 0;
  }
  pCVar7 = this->currentChunk;
  if (pCVar7 == (Chunk *)0x0) {
    AssertCount = AssertCount + 1;
    lStack_70 = 0x6fbf72;
    Js::Throw::LogAssert();
    lStack_70 = 0x6fbf82;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    lStack_70 = 0x6fbfaa;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x106,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar4) {
LAB_006fc15c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  uVar6 = (ulong)targetCount;
  pCVar9 = pCVar7->nextChunk;
  uVar12 = uVar6;
  if (targetCount != 0) {
    lStack_70 = 0x6fbfe6;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar11 = 0;
    do {
      uVar12 = uVar11;
      if (pCVar9 == (Chunk *)0x0) break;
      lStack_70 = 0x6fc003;
      bVar4 = IsEmpty(targetStacks[uVar11]);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        lStack_70 = 0x6fc015;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        lStack_70 = 0x6fc03c;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                           ,0x11a,"(targetStacks[targetIndex]->IsEmpty())",
                           "targetStacks[targetIndex]->IsEmpty()");
        if (!bVar4) goto LAB_006fc15c;
        *puVar5 = 0;
      }
      lStack_70 = 0x6fc055;
      Release(targetStacks[uVar11]);
      targetStacks[uVar11]->currentChunk = pCVar9;
      targetStacks[uVar11]->chunkStart = (MarkCandidate *)(pCVar9 + 1);
      targetStacks[uVar11]->chunkEnd = (MarkCandidate *)(pCVar9 + 0x80);
      targetStacks[uVar11]->nextEntry = targetStacks[uVar11]->chunkEnd;
      this->pageCount = this->pageCount - 1;
      pPVar2 = targetStacks[uVar11];
      pPVar2->pageCount = 1;
      this->count = this->count - 0xfe;
      pPVar2->count = 0xfe;
      targetCurrents[uVar11 - 1] = pCVar9;
      uVar11 = uVar11 + 1;
      pCVar9 = pCVar9->nextChunk;
      uVar12 = uVar6;
    } while (uVar6 != uVar11);
  }
  uVar10 = (uint)uVar12;
  do {
    do {
      pCVar8 = pCVar9;
      if (pCVar8 == (Chunk *)0x0) {
        pCVar7->nextChunk = (Chunk *)0x0;
        if (uVar10 != 0) {
          uVar6 = 0;
          do {
            targetCurrents[uVar6 - 1]->nextChunk = (Chunk *)0x0;
            uVar6 = uVar6 + 1;
          } while ((uVar12 & 0xffffffff) != uVar6);
        }
        return uVar10;
      }
      pCVar7->nextChunk = pCVar8;
      pCVar9 = pCVar8->nextChunk;
      pCVar7 = pCVar8;
    } while ((uVar10 == 0) || (pCVar9 == (Chunk *)0x0));
    uVar6 = 1;
    do {
      *(Chunk **)((&lStack_70)[uVar6] + 0x18) = pCVar9;
      (&lStack_70)[uVar6] = (long)pCVar9;
      this->pageCount = this->pageCount - 1;
      pPVar2 = targetStacks[uVar6 - 1];
      psVar1 = &pPVar2->pageCount;
      *psVar1 = *psVar1 + 1;
      this->count = this->count - 0xfe;
      psVar1 = &pPVar2->count;
      *psVar1 = *psVar1 + 0xfe;
      pCVar9 = pCVar9->nextChunk;
      if ((uVar12 & 0xffffffff) <= uVar6) break;
      uVar6 = uVar6 + 1;
    } while (pCVar9 != (Chunk *)0x0);
  } while( true );
}

Assistant:

uint PageStack<T>::Split(uint targetCount, __in_ecount(targetCount) PageStack<T> ** targetStacks)
{
    // Split the current stack up to [targetCount + 1] ways.
    // [targetStacks] contains the target stacks and must have [targetCount] elements.

    Assert(targetCount > 0 && targetCount <= MaxSplitTargets);
    Assert(targetStacks);
    __analysis_assume(targetCount <= MaxSplitTargets);

    Chunk * mainCurrent;
    Chunk * targetCurrents[MaxSplitTargets];

    // Do the initial split of first pages for each target stack.
    // During this, if we run out of pages, we will return a value < maxSplit to
    // indicate that the split was less than the maximum possible.

    Chunk * chunk = this->currentChunk;
    Assert(chunk != nullptr);

    // The first chunk is assigned to the main stack, and since it's already there,
    // we just advance to the next chunk and start assigning to each target stack.
    mainCurrent = chunk;
    chunk = chunk->nextChunk;

    uint targetIndex = 0;
    while (targetIndex < targetCount)
    {
        if (chunk == nullptr)
        {
            // No more pages.  Adjust targetCount down to what we were actually able to do.
            // We'll return this number below so the caller knows.
            targetCount = targetIndex;
            break;
        }

        // Target stack should be empty.
        // If it has a free page currently, release it.
        Assert(targetStacks[targetIndex]->IsEmpty());
        targetStacks[targetIndex]->Release();

        targetStacks[targetIndex]->currentChunk = chunk;
        targetStacks[targetIndex]->chunkStart = chunk->entries;
        targetStacks[targetIndex]->chunkEnd = &chunk->entries[EntriesPerChunk];
        targetStacks[targetIndex]->nextEntry = targetStacks[targetIndex]->chunkEnd;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        this->pageCount--;
        targetStacks[targetIndex]->pageCount = 1;
#endif
#if DBG
        this->count -= EntriesPerChunk;
        targetStacks[targetIndex]->count = EntriesPerChunk;
#endif

        targetCurrents[targetIndex] = chunk;

        chunk = chunk->nextChunk;
        targetIndex++;
    }

    // Loop through the remaining chunks (if any),
    // assigning each chunk to the main chunk and the target chunks in turn,
    // and linking each chunk to the end of the respective list.
    while (true)
    {
        if (chunk == nullptr)
        {
            break;
        }

        mainCurrent->nextChunk = chunk;
        mainCurrent = chunk;

        chunk = chunk->nextChunk;

        targetIndex = 0;
        while (targetIndex < targetCount)
        {
            if (chunk == nullptr)
            {
                break;
            }

            targetCurrents[targetIndex]->nextChunk = chunk;
            targetCurrents[targetIndex] = chunk;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            this->pageCount--;
            targetStacks[targetIndex]->pageCount++;
#endif
#if DBG
            this->count -= EntriesPerChunk;
            targetStacks[targetIndex]->count += EntriesPerChunk;
#endif

            chunk = chunk->nextChunk;
            targetIndex++;
        }
    }

    // Terminate all the split chunk lists with null
    mainCurrent->nextChunk = nullptr;
    targetIndex = 0;
    while (targetIndex < targetCount)
    {
        targetCurrents[targetIndex]->nextChunk = nullptr;
        targetIndex++;
    }

    // Return the actual split count we were able to do, which may have been lowered above.
    return targetCount;
}